

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O2

AggregateFunction * __thiscall
duckdb::GetTypedApproxQuantileListAggregateFunction<long,long>
          (AggregateFunction *__return_storage_ptr__,duckdb *this,LogicalType *type)

{
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_59;
  LogicalType local_58;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_40;
  LogicalType result_type;
  
  LogicalType::LIST(&result_type,(LogicalType *)this);
  LogicalType::LogicalType(&local_58,(LogicalType *)this);
  __l._M_len = 1;
  __l._M_array = &local_58;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_40,__l,&local_59);
  AggregateFunction::AggregateFunction
            (__return_storage_ptr__,(vector<duckdb::LogicalType,_true> *)&local_40,&result_type,
             AggregateFunction::StateSize<duckdb::ApproxQuantileState>,
             AggregateFunction::
             StateInitialize<duckdb::ApproxQuantileState,duckdb::ApproxQuantileListOperation<long>,(duckdb::AggregateDestructorType)0>
             ,AggregateFunction::
              UnaryScatterUpdate<duckdb::ApproxQuantileState,long,duckdb::ApproxQuantileListOperation<long>>
             ,AggregateFunction::
              StateCombine<duckdb::ApproxQuantileState,duckdb::ApproxQuantileListOperation<long>>,
             AggregateFunction::
             StateFinalize<duckdb::ApproxQuantileState,duckdb::list_entry_t,duckdb::ApproxQuantileListOperation<long>>
             ,AggregateFunction::
              UnaryUpdate<duckdb::ApproxQuantileState,long,duckdb::ApproxQuantileListOperation<long>>
             ,(bind_aggregate_function_t)0x0,
             AggregateFunction::
             StateDestroy<duckdb::ApproxQuantileState,duckdb::ApproxQuantileListOperation<long>>,
             (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
             (aggregate_deserialize_t)0x0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_40);
  LogicalType::~LogicalType(&local_58);
  LogicalType::~LogicalType(&result_type);
  __return_storage_ptr__->serialize = ApproximateQuantileBindData::Serialize;
  __return_storage_ptr__->deserialize = ApproximateQuantileBindData::Deserialize;
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetTypedApproxQuantileListAggregateFunction(const LogicalType &type) {
	using STATE = ApproxQuantileState;
	using OP = ApproxQuantileListOperation<INPUT_TYPE>;
	auto fun = ApproxQuantileListAggregate<STATE, INPUT_TYPE, list_entry_t, OP>(type, type);
	fun.serialize = ApproximateQuantileBindData::Serialize;
	fun.deserialize = ApproximateQuantileBindData::Deserialize;
	return fun;
}